

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

uchar * __thiscall
ON_ArchivableDictionaryPrivate::SetValue<unsigned_char>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,uchar *value)

{
  ON_wString OVar1;
  int iVar2;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  _Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar5;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_30;
  
  ON_wString::ON_wString(&local_30.first,key);
  local_30.second._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
  ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<DictionaryEntry,_std::default_delete<DictionaryEntry>,_true,_true>)
       (__uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>)0x0;
  pVar5 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::
          _M_insert_unique<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_map,&local_30);
  _Var3 = pVar5.first._M_node;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair(&local_30);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar2 = (**(code **)(*(long *)_Var3._M_node[1]._M_parent + 0x10))();
    if (iVar2 == 2) {
      p_Var4 = _Var3._M_node[1]._M_parent;
      *(uchar *)&p_Var4->_M_parent = *value;
      goto LAB_003bd803;
    }
  }
  std::make_unique<Entry<unsigned_char>,unsigned_char_const&>((uchar *)&local_30);
  OVar1.m_s = local_30.first.m_s;
  local_30.first.m_s = (wchar_t *)0x0;
  p_Var4 = _Var3._M_node[1]._M_parent;
  _Var3._M_node[1]._M_parent = (_Base_ptr)OVar1.m_s;
  if (p_Var4 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)p_Var4 + 8))();
    if (local_30.first.m_s != (wchar_t *)0x0) {
      (**(code **)(*(long *)local_30.first.m_s + 8))();
    }
  }
  p_Var4 = _Var3._M_node[1]._M_parent;
LAB_003bd803:
  return (uchar *)&p_Var4->_M_parent;
}

Assistant:

const T& SetValue(const wchar_t* key, const T& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (!r.second && entry_ptr->EntryType() == Entry<T>::Type)
    {
      return static_cast<Entry<T>*>(entry_ptr.get())->Value() = value;
    }
    else
    {
      entry_ptr = make_entry(value);
      return static_cast<Entry<T>*>(entry_ptr.get())->Value();
    }
  }